

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::SetWindingCount(Clipper *this,TEdge *edge)

{
  uint uVar1;
  TEdge **ppTVar2;
  TEdge *pTVar3;
  int iVar4;
  uint uVar5;
  
  pTVar3 = edge;
  do {
    pTVar3 = pTVar3->prevInAEL;
    if (pTVar3 == (TEdge *)0x0) {
      edge->windCnt = edge->windDelta;
      edge->windCnt2 = 0;
      ppTVar2 = &this->m_ActiveEdges;
      goto LAB_006856a9;
    }
  } while (pTVar3->polyType != edge->polyType);
  if ((&this->m_ClipFillType)[edge->polyType == ptSubject] == pftEvenOdd) {
    edge->windCnt = 1;
    goto LAB_0068569f;
  }
  iVar4 = pTVar3->windDelta;
  uVar5 = pTVar3->windCnt;
  uVar1 = -uVar5;
  if (0 < (int)uVar5) {
    uVar1 = uVar5;
  }
  if ((int)(iVar4 * uVar5) < 0) {
    if (uVar1 < 2) {
      iVar4 = iVar4 + uVar5 + edge->windDelta;
      goto LAB_0068569c;
    }
    if (-1 < iVar4 * edge->windDelta) {
      edge->windCnt = edge->windDelta + uVar5;
      goto LAB_0068569f;
    }
  }
  else if (((uVar1 < 2) || (-1 < iVar4 * edge->windDelta)) &&
          (iVar4 = edge->windDelta + uVar5, iVar4 != 0)) {
LAB_0068569c:
    edge->windCnt = iVar4;
    goto LAB_0068569f;
  }
  edge->windCnt = uVar5;
LAB_0068569f:
  edge->windCnt2 = pTVar3->windCnt2;
  ppTVar2 = &pTVar3->nextInAEL;
LAB_006856a9:
  pTVar3 = *ppTVar2;
  if ((&this->m_ClipFillType)[edge->polyType != ptSubject] == pftEvenOdd) {
    if (pTVar3 != edge) {
      uVar5 = edge->windCnt2;
      do {
        uVar5 = (uint)(uVar5 == 0);
        edge->windCnt2 = uVar5;
        pTVar3 = pTVar3->nextInAEL;
      } while (pTVar3 != edge);
    }
  }
  else if (pTVar3 != edge) {
    iVar4 = edge->windCnt2;
    do {
      iVar4 = iVar4 + pTVar3->windDelta;
      edge->windCnt2 = iVar4;
      pTVar3 = pTVar3->nextInAEL;
    } while (pTVar3 != edge);
  }
  return;
}

Assistant:

void Clipper::SetWindingCount(TEdge &edge)
{
  TEdge *e = edge.prevInAEL;
  //find the edge of the same polytype that immediately preceeds 'edge' in AEL
  while ( e  && e->polyType != edge.polyType ) e = e->prevInAEL;
  if ( !e )
  {
    edge.windCnt = edge.windDelta;
    edge.windCnt2 = 0;
    e = m_ActiveEdges; //ie get ready to calc windCnt2
  } else if ( IsEvenOddFillType(edge) )
  {
    //EvenOdd filling ...
    edge.windCnt = 1;
    edge.windCnt2 = e->windCnt2;
    e = e->nextInAEL; //ie get ready to calc windCnt2
  } else
  {
    //nonZero, Positive or Negative filling ...
    if ( e->windCnt * e->windDelta < 0 )
    {
      if (Abs(e->windCnt) > 1)
      {
        if (e->windDelta * edge.windDelta < 0) edge.windCnt = e->windCnt;
        else edge.windCnt = e->windCnt + edge.windDelta;
      } else
        edge.windCnt = e->windCnt + e->windDelta + edge.windDelta;
    } else
    {
      if ( Abs(e->windCnt) > 1 && e->windDelta * edge.windDelta < 0)
        edge.windCnt = e->windCnt;
      else if ( e->windCnt + edge.windDelta == 0 )
        edge.windCnt = e->windCnt;
      else edge.windCnt = e->windCnt + edge.windDelta;
    }
    edge.windCnt2 = e->windCnt2;
    e = e->nextInAEL; //ie get ready to calc windCnt2
  }

  //update windCnt2 ...
  if ( IsEvenOddAltFillType(edge) )
  {
    //EvenOdd filling ...
    while ( e != &edge )
    {
      edge.windCnt2 = (edge.windCnt2 == 0) ? 1 : 0;
      e = e->nextInAEL;
    }
  } else
  {
    //nonZero, Positive or Negative filling ...
    while ( e != &edge )
    {
      edge.windCnt2 += e->windDelta;
      e = e->nextInAEL;
    }
  }
}